

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_temp_impl(llama_token_data_array *cur_p,float temp)

{
  llama_token_data *plVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  
  if (temp <= 0.0) {
    plVar1 = cur_p->data;
    uVar2 = cur_p->size;
    fVar9 = plVar1->logit;
    pfVar5 = &plVar1[1].logit;
    uVar7 = 0;
    for (uVar6 = 1; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      if (*pfVar5 <= fVar9) {
        *pfVar5 = -INFINITY;
      }
      else {
        plVar1[uVar7].logit = -INFINITY;
        fVar9 = *pfVar5;
        uVar7 = uVar6;
      }
      pfVar5 = pfVar5 + 3;
    }
  }
  else {
    sVar3 = cur_p->size;
    lVar4 = 4;
    while (bVar8 = sVar3 != 0, sVar3 = sVar3 - 1, bVar8) {
      *(float *)((long)&cur_p->data->id + lVar4) = *(float *)((long)&cur_p->data->id + lVar4) / temp
      ;
      lVar4 = lVar4 + 0xc;
    }
  }
  return;
}

Assistant:

static void llama_sampler_temp_impl(llama_token_data_array * cur_p, float temp) {
    if (temp <= 0.0f) {
        // find the token with the highest logit and set the rest to -inf
        size_t max_i = 0;
        float  max_l = cur_p->data[0].logit;

        for (size_t i = 1; i < cur_p->size; ++i) {
            if (cur_p->data[i    ].logit > max_l) {
                cur_p->data[max_i].logit = -INFINITY;
                max_i = i;
                max_l = cur_p->data[i].logit;
            } else {
                cur_p->data[i].logit = -INFINITY;
            }
        }

        return;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].logit /= temp;
    }
}